

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_reporter_xml.hpp
# Opt level: O0

void __thiscall Catch::XmlReporter::testCaseEnded(XmlReporter *this,TestCaseStats *testCaseStats)

{
  int iVar1;
  IConfig *pIVar2;
  double local_b0;
  allocator local_a1;
  string local_a0 [38];
  bool local_7a;
  allocator local_79;
  string local_78 [55];
  allocator local_41;
  string local_40 [32];
  ScopedElement e;
  TestCaseStats *testCaseStats_local;
  XmlReporter *this_local;
  
  e.m_writer = (XmlWriter *)testCaseStats;
  StreamingReporterBase::testCaseEnded(&this->super_StreamingReporterBase,testCaseStats);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,"OverallResult",&local_41);
  XmlWriter::scopedElement((XmlWriter *)&stack0xffffffffffffffe0,(string *)&this->m_xml);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_78,"success",&local_79);
  local_7a = Counts::allOk((Counts *)&e.m_writer[3].m_os);
  XmlWriter::ScopedElement::writeAttribute<bool>
            ((ScopedElement *)&stack0xffffffffffffffe0,(string *)local_78,&local_7a);
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  pIVar2 = Ptr<Catch::IConfig>::operator->(&(this->super_StreamingReporterBase).m_config);
  iVar1 = (*(pIVar2->super_IShared).super_NonCopyable._vptr_NonCopyable[0xc])();
  if (iVar1 == 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_a0,"durationInSeconds",&local_a1);
    local_b0 = Timer::getElapsedSeconds(&this->m_testCaseTimer);
    XmlWriter::ScopedElement::writeAttribute<double>
              ((ScopedElement *)&stack0xffffffffffffffe0,(string *)local_a0,&local_b0);
    std::__cxx11::string::~string(local_a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  }
  XmlWriter::endElement(&this->m_xml);
  XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)&stack0xffffffffffffffe0);
  return;
}

Assistant:

virtual void testCaseEnded( TestCaseStats const& testCaseStats ) {
            StreamingReporterBase::testCaseEnded( testCaseStats );
            XmlWriter::ScopedElement e = m_xml.scopedElement( "OverallResult" );
            e.writeAttribute( "success", testCaseStats.totals.assertions.allOk() );

            if ( m_config->showDurations() == ShowDurations::Always )
                e.writeAttribute( "durationInSeconds", m_testCaseTimer.getElapsedSeconds() );

            m_xml.endElement();
        }